

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O1

void object_sferror(void *x,char *header,char *filename,int errnum,t_soundfile *sf)

{
  char *pcVar1;
  char *pcVar2;
  
  if ((sf != (t_soundfile *)0x0) && (sf->sf_type != (_soundfile_type *)0x0)) {
    pcVar1 = sf->sf_type->t_name;
    if (errnum + 0x3ebU < 4) {
      pcVar2 = (&PTR_anon_var_dwarf_11788_001e2aa0)[errnum + 0x3ebU];
    }
    else {
      pcVar2 = strerror(errnum);
    }
    pd_error(x,"%s %s: %s: %s",header,pcVar1,filename,pcVar2);
    return;
  }
  if (errnum + 0x3ebU < 4) {
    pcVar1 = (&PTR_anon_var_dwarf_11788_001e2aa0)[errnum + 0x3ebU];
  }
  else {
    pcVar1 = strerror(errnum);
  }
  pd_error(x,"%s: %s: %s",header,filename,pcVar1);
  return;
}

Assistant:

static void object_sferror(const void *x, const char *header,
    const char *filename, int errnum, const t_soundfile *sf)
{
    if (sf && sf->sf_type)
        pd_error(x, "%s %s: %s: %s", header, sf->sf_type->t_name, filename,
            soundfile_strerror(errnum));
    else
        pd_error(x, "%s: %s: %s", header, filename, soundfile_strerror(errnum));
}